

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bash_prg.c
# Opt level: O0

void bashPrgSqueezeStep(void *buf,size_t count,void *state)

{
  octet *in_RDX;
  ulong in_RSI;
  bash_prg_st *st;
  void *in_stack_ffffffffffffffd8;
  ulong local_10;
  
  if (in_RSI < (ulong)(*(long *)(in_RDX + 0xd0) - *(long *)(in_RDX + 0xd8))) {
    memCopy(in_RDX,in_stack_ffffffffffffffd8,0x130ee3);
    *(ulong *)(in_RDX + 0xd8) = in_RSI + *(long *)(in_RDX + 0xd8);
  }
  else {
    memCopy(in_RDX,in_stack_ffffffffffffffd8,0x130f37);
    local_10 = in_RSI - (*(long *)(in_RDX + 0xd0) - *(long *)(in_RDX + 0xd8));
    bashF(in_RDX,in_stack_ffffffffffffffd8);
    while (*(ulong *)(in_RDX + 0xd0) <= local_10) {
      memCopy(in_RDX,in_stack_ffffffffffffffd8,0x130fcf);
      local_10 = local_10 - *(long *)(in_RDX + 0xd0);
      bashF(in_RDX,in_stack_ffffffffffffffd8);
    }
    *(ulong *)(in_RDX + 0xd8) = local_10;
    if (local_10 != 0) {
      memCopy(in_RDX,in_stack_ffffffffffffffd8,0x131049);
    }
  }
  return;
}

Assistant:

void bashPrgSqueezeStep(void* buf, size_t count, void* state)
{
	bash_prg_st* st = (bash_prg_st*)state;
	ASSERT(memIsDisjoint2(st, bashPrg_keep(), buf, count));
	// остатка буфера достаточно?
	if (count < st->buf_len - st->pos)
	{
		memCopy(buf, st->s + st->pos, count);
		st->pos += count;
		return;
	}
	// новый буфер
	memCopy(buf, st->s + st->pos, st->buf_len - st->pos);
	buf = (octet*)buf + st->buf_len - st->pos;
	count -= st->buf_len - st->pos;
	bashF(st->s, st->stack);
	// цикл по полным блокам
	while (count >= st->buf_len)
	{
		memCopy(buf, st->s, st->buf_len);
		buf = (octet*)buf + st->buf_len;
		count -= st->buf_len;
		bashF(st->s, st->stack);
	}
	// неполный блок
	if (st->pos = count)
		memCopy(buf, st->s, count);
}